

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O1

bool __thiscall
ON_SubD_FixedSizeHeap::ReserveSubDWorkspace(ON_SubD_FixedSizeHeap *this,ON_SubDFace *center_face0)

{
  ushort uVar1;
  ushort uVar2;
  ON_SubDVertex *this_00;
  ON_SubDFace *pOVar3;
  uint uVar14;
  byte in_AL;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ON_SubDEdge *pOVar9;
  char cVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  ON_SubDEdgePtr *pOVar15;
  byte local_64;
  
  if (center_face0 == (ON_SubDFace *)0x0) {
    Destroy(this);
    in_AL = 1;
  }
  else {
    uVar1 = center_face0->m_edge_count;
    if (uVar1 < 3) {
      bVar4 = true;
    }
    else {
      uVar12 = 4;
      if (4 < uVar1) {
        uVar12 = (uint)uVar1;
      }
      pOVar9 = ON_SubDFace::Edge(center_face0,uVar1 - 1);
      if (pOVar9 == (ON_SubDEdge *)0x0) {
        uVar6 = 0;
        cVar10 = '\x02';
        iVar13 = 0;
        local_64 = 0;
        uVar8 = 0;
      }
      else {
        pOVar15 = center_face0->m_edge4;
        bVar4 = ON_SubDEdge::IsHardCrease(pOVar9);
        uVar7 = 0;
        local_64 = 0;
        iVar13 = 0;
        uVar6 = 0;
        while ((uVar8 = uVar7, uVar7 != 4 ||
               (pOVar15 = center_face0->m_edgex, pOVar15 != (ON_SubDEdgePtr *)0x0))) {
          uVar11 = pOVar15->m_ptr;
          pOVar9 = (ON_SubDEdge *)(uVar11 & 0xfffffffffffffff8);
          if (pOVar9 == (ON_SubDEdge *)0x0) break;
          bVar5 = ON_SubDEdge::IsHardCrease(pOVar9);
          this_00 = pOVar9->m_vertex[(uint)uVar11 & 1];
          if (this_00 == (ON_SubDVertex *)0x0) break;
          uVar2 = this_00->m_edge_count;
          if ((uVar2 < 2) || (uVar2 < this_00->m_face_count)) break;
          uVar8 = 4;
          if (4 < uVar2) {
            uVar8 = (uint)uVar2;
          }
          if (((bVar4 & bVar5) != 1) || (bVar4 = ON_SubDVertex::IsCreaseOrCorner(this_00), !bVar4))
          {
            if (this_00->m_edge_count == 2) {
              local_64 = 1;
            }
            if ((ulong)this_00->m_face_count != 0) {
              uVar11 = 0;
              do {
                pOVar3 = this_00->m_faces[uVar11];
                if (pOVar3 != center_face0 && pOVar3 != (ON_SubDFace *)0x0) {
                  uVar14._0_2_ = pOVar3->m_edge_count;
                  uVar14._2_2_ = pOVar3->m_edgex_capacity;
                  if ((ushort)(undefined2)uVar14 < 5) {
                    uVar14 = 4;
                  }
                  uVar12 = uVar12 + (uVar14 & 0xffff);
                }
                uVar11 = uVar11 + 1;
              } while (this_00->m_face_count != uVar11);
            }
          }
          uVar6 = uVar6 + uVar2;
          iVar13 = uVar8 + iVar13;
          uVar7 = uVar7 + 1;
          pOVar15 = pOVar15 + 1;
          bVar4 = bVar5;
          uVar8 = (uint)uVar1;
          if (uVar7 == uVar1) break;
        }
        cVar10 = (uVar8 != uVar1) * '\x02';
      }
      in_AL = (byte)uVar8;
      if (cVar10 == '\0') {
        uVar8 = ON_SubDComponentBase::SubdivisionLevel(&center_face0->super_ON_SubDComponentBase);
        in_AL = Internal_ReserveSubDWorkspace
                          (this,(ulong)((uVar6 - uVar1) * 2 + 1),(ulong)uVar6,
                           (ulong)((uVar6 - uVar1) * 8 + (iVar13 + uVar12) * 2),
                           (bool)(uVar8 == 0 | local_64));
        cVar10 = '\x01';
      }
      bVar4 = cVar10 == '\x02';
    }
    if (bVar4) {
      Destroy(this);
      ON_SubDIncrementErrorCount();
      in_AL = 0;
    }
  }
  return (bool)(in_AL & 1);
}

Assistant:

bool ON_SubD_FixedSizeHeap::ReserveSubDWorkspace(
  const ON_SubDFace* center_face0
  )
{
  unsigned int v_capacity =  0;
  unsigned int f_capacity =  0;
  unsigned int a_capacity =  0;

  for (;;)
  {
    if (nullptr == center_face0)
      break;

    const unsigned int N = center_face0->m_edge_count;
    if (N <= 2)
      break;

    unsigned int S = 0;  // Set S = sum of the number of edges attached to each vertex of center_face0.
    unsigned int T = Internal_AtLeast4(N);  // Set T = capacity required for vertex edge arrays on face subdivision vertices
    unsigned int X = 0;
    bool bValenceTwoVertices = false; // bValenceTwoVertices = true if center_face0 has a valence 2 vertex and we need the hash table
    {
      const ON_SubDEdgePtr* edges = center_face0->m_edge4;
      ON__UINT_PTR edge_ptr;
      const ON_SubDEdge* edge;
      const ON_SubDVertex* vertex;
      const ON_SubDFace* vertex_face;
      unsigned int fei;
      edge = center_face0->Edge(N - 1);
      if (nullptr == edge)
        break;
      bool bEdgeIsHardCrease[2] = { false, edge->IsHardCrease() };
      for (fei = 0; fei < N; fei++, edges++)
      {
        if (4 == fei)
        {
          edges = center_face0->m_edgex;
          if (nullptr == edges)
            break;
        }
        edge_ptr = edges->m_ptr;
        edge = ON_SUBD_EDGE_POINTER(edge_ptr);
        if (nullptr == edge)
          break;
        bEdgeIsHardCrease[0] = bEdgeIsHardCrease[1];
        bEdgeIsHardCrease[1] = edge->IsHardCrease();
        vertex = edge->m_vertex[ON_SUBD_EDGE_DIRECTION(edge_ptr)];
        if (nullptr == vertex)
          break;
        if (vertex->m_edge_count < 2)
          break;
        if (vertex->m_edge_count < vertex->m_face_count)
          break;
        S += vertex->m_edge_count;
        X += Internal_AtLeast4(vertex->m_edge_count);
        if ( bEdgeIsHardCrease[0] && bEdgeIsHardCrease[1] && vertex->IsCreaseOrCorner() )
        {
          // If this vertex has multiple sectors, the other sectors are isolated from center_face0 by hard creases.
          continue;
        }
        if (2 == vertex->m_edge_count)
        {
          // ring face has valence 2 vertex and the subdivision point for vertex_face
          // may be reference by 2 different edges from center_face0
          bValenceTwoVertices = true;
        }
        for (unsigned short vfi = 0; vfi < vertex->m_face_count; ++vfi)
        {
          vertex_face = vertex->m_faces[vfi];
          if (nullptr == vertex_face || center_face0 == vertex_face)
            continue;
          T += Internal_AtLeast4(vertex_face->m_edge_count);
        }
      }
      if (fei != N)
        break;
    }

    // NOTE: S >= 2*N
    v_capacity =  2*(S - N) + 1; // maximum possible and occurs when all face0 edges are distinct and smooth
    f_capacity =  S;  // maximum possible and occurs when all face0 edges are distinct and smooth

    // T = capacity required for vertex edge arrays on face subdivision vertices
    // 4*(S-N) = capacity required for vertex edge arrays on edge subdivision vertices
    // X = capacity required for vertex edge arrays on vertex subdivision vertices
    //
    a_capacity = 2*( X + T + 4 * (S - N) ); // Twice the number of edges from all subdivision vertices.

    return Internal_ReserveSubDWorkspace(
      v_capacity,
      f_capacity,
      a_capacity,
      (0U == center_face0->SubdivisionLevel()) || bValenceTwoVertices
    );
  }

  Destroy();
  if (nullptr == center_face0 )
    return true;

  return ON_SUBD_RETURN_ERROR(false);
}